

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,char **arg_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3)

{
  string_view format_00;
  Arg *in_stack_fffffffffffffe80;
  Arg local_138;
  Arg local_108;
  Arg local_d8;
  Arg local_a8;
  lts_20250127 *local_78;
  char *pcStack_70;
  string local_68;
  string_view local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local_2;
  char **arg_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local;
  Output *this_local;
  string_view format_local;
  
  pcStack_70 = format._M_str;
  local_78 = (lts_20250127 *)format._M_len;
  local_38 = arg_2;
  arg_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg_1;
  arg_local_1 = (char **)arg;
  arg_local = &this->output_;
  this_local = (Output *)local_78;
  format_local._M_len = (size_t)pcStack_70;
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_a8,arg);
  absl::lts_20250127::substitute_internal::Arg::Arg
            (&local_d8,*(Nullable<const_char_*> *)arg_local_2);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_108,local_38);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_138,arg_3);
  format_00._M_str = (char *)&local_a8;
  format_00._M_len = (size_t)pcStack_70;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_68,local_78,format_00,&local_d8,&local_108,&local_138,in_stack_fffffffffffffe80)
  ;
  local_48 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_68);
  Write(this,local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }